

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void idct32_low8_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint out_shift_00;
  uint bd_00;
  uint do_cols_00;
  uint uVar6;
  uint uVar7;
  int in_ECX;
  int in_EDX;
  int in_R8D;
  __m256i bf1 [32];
  __m256i clamp_hi;
  __m256i clamp_lo;
  int log_range;
  __m256i rounding;
  __m256i cospim16;
  __m256i cospi16;
  __m256i cospim48;
  __m256i cospi48;
  __m256i cospim32;
  __m256i cospi32;
  __m256i cospim24;
  __m256i cospim56;
  __m256i cospim8;
  __m256i cospim40;
  __m256i cospi8;
  __m256i cospi40;
  __m256i cospi24;
  __m256i cospi56;
  __m256i cospim52;
  __m256i cospi4;
  __m256i cospi12;
  __m256i cospi60;
  __m256i cospim50;
  __m256i cospim58;
  __m256i cospi2;
  __m256i cospi10;
  __m256i cospi6;
  __m256i cospi54;
  __m256i cospi14;
  __m256i cospi62;
  int32_t *cospi;
  __m256i *palVar8;
  undefined4 uVar9;
  undefined8 in_stack_ffffffffffffefb8;
  __m256i *cospim24_00;
  undefined4 in_stack_ffffffffffffefc0;
  int iVar10;
  undefined4 in_stack_ffffffffffffefc4;
  int in_stack_ffffffffffffefc8;
  undefined4 in_stack_ffffffffffffefcc;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  undefined1 local_bc0 [16];
  undefined1 auStack_bb0 [16];
  longlong local_ba0;
  longlong lStack_b98;
  longlong lStack_b90;
  longlong lStack_b88;
  int local_b64;
  undefined1 local_b60 [16];
  undefined1 auStack_b50 [16];
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  longlong local_a80;
  longlong lStack_a78;
  longlong lStack_a70;
  longlong lStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  longlong local_9e0;
  longlong lStack_9d8;
  longlong lStack_9d0;
  longlong lStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  int32_t *local_800;
  int local_7f4;
  int local_7f0;
  int local_7ec;
  uint local_7d4;
  uint local_7d0;
  uint local_7cc;
  uint local_7c8;
  uint local_7c4;
  uint local_7c0;
  uint local_7bc;
  uint local_7b8;
  uint local_7b4;
  uint local_7b0;
  uint local_7ac;
  uint local_7a8;
  uint local_7a4;
  uint local_7a0;
  uint local_79c;
  uint local_798;
  uint local_794;
  uint local_790;
  uint local_78c;
  uint local_788;
  uint local_784;
  uint local_780;
  uint local_77c;
  uint local_778;
  uint local_774;
  uint local_770;
  uint local_76c;
  uint local_768;
  uint local_764;
  undefined1 local_760 [16];
  undefined1 auStack_750 [16];
  uint local_740;
  uint local_73c;
  uint local_738;
  uint local_734;
  uint local_730;
  uint local_72c;
  uint local_728;
  uint local_724;
  undefined1 local_720 [16];
  undefined1 auStack_710 [16];
  uint local_700;
  uint local_6fc;
  uint local_6f8;
  uint local_6f4;
  uint local_6f0;
  uint local_6ec;
  uint local_6e8;
  uint local_6e4;
  undefined1 local_6e0 [16];
  undefined1 auStack_6d0 [16];
  uint local_6c0;
  uint local_6bc;
  uint local_6b8;
  uint local_6b4;
  uint local_6b0;
  uint local_6ac;
  uint local_6a8;
  uint local_6a4;
  undefined1 local_6a0 [16];
  undefined1 auStack_690 [16];
  uint local_680;
  uint local_67c;
  uint local_678;
  uint local_674;
  uint local_670;
  uint local_66c;
  uint local_668;
  uint local_664;
  undefined1 local_660 [16];
  undefined1 auStack_650 [16];
  uint local_640;
  uint local_63c;
  uint local_638;
  uint local_634;
  uint local_630;
  uint local_62c;
  uint local_628;
  uint local_624;
  undefined1 local_620 [16];
  undefined1 auStack_610 [16];
  uint local_600;
  uint local_5fc;
  uint local_5f8;
  uint local_5f4;
  uint local_5f0;
  uint local_5ec;
  uint local_5e8;
  uint local_5e4;
  undefined1 local_5e0 [16];
  undefined1 auStack_5d0 [16];
  uint local_5c0;
  uint local_5bc;
  uint local_5b8;
  uint local_5b4;
  uint local_5b0;
  uint local_5ac;
  uint local_5a8;
  uint local_5a4;
  undefined1 local_5a0 [16];
  undefined1 auStack_590 [16];
  uint local_580;
  uint local_57c;
  uint local_578;
  uint local_574;
  uint local_570;
  uint local_56c;
  uint local_568;
  uint local_564;
  undefined1 local_560 [16];
  undefined1 auStack_550 [16];
  uint local_540;
  uint local_53c;
  uint local_538;
  uint local_534;
  uint local_530;
  uint local_52c;
  uint local_528;
  uint local_524;
  undefined1 local_520 [16];
  undefined1 auStack_510 [16];
  uint local_500;
  uint local_4fc;
  uint local_4f8;
  uint local_4f4;
  uint local_4f0;
  uint local_4ec;
  uint local_4e8;
  uint local_4e4;
  undefined1 local_4e0 [16];
  undefined1 auStack_4d0 [16];
  uint local_4c0;
  uint local_4bc;
  uint local_4b8;
  uint local_4b4;
  uint local_4b0;
  uint local_4ac;
  uint local_4a8;
  uint local_4a4;
  undefined1 local_4a0 [16];
  undefined1 auStack_490 [16];
  uint local_480;
  uint local_47c;
  uint local_478;
  uint local_474;
  uint local_470;
  uint local_46c;
  uint local_468;
  uint local_464;
  undefined1 local_460 [16];
  undefined1 auStack_450 [16];
  uint local_440;
  uint local_43c;
  uint local_438;
  uint local_434;
  uint local_430;
  uint local_42c;
  uint local_428;
  uint local_424;
  undefined1 local_420 [16];
  undefined1 auStack_410 [16];
  uint local_400;
  uint local_3fc;
  uint local_3f8;
  uint local_3f4;
  uint local_3f0;
  uint local_3ec;
  uint local_3e8;
  uint local_3e4;
  undefined1 local_3e0 [16];
  undefined1 auStack_3d0 [16];
  uint local_3c0;
  uint local_3bc;
  uint local_3b8;
  uint local_3b4;
  uint local_3b0;
  uint local_3ac;
  uint local_3a8;
  uint local_3a4;
  undefined1 local_3a0 [16];
  undefined1 auStack_390 [16];
  uint local_380;
  uint local_37c;
  uint local_378;
  uint local_374;
  uint local_370;
  uint local_36c;
  uint local_368;
  uint local_364;
  undefined1 local_360 [16];
  undefined1 auStack_350 [16];
  uint local_340;
  uint local_33c;
  uint local_338;
  uint local_334;
  uint local_330;
  uint local_32c;
  uint local_328;
  uint local_324;
  undefined1 local_320 [16];
  undefined1 auStack_310 [16];
  uint local_300;
  uint local_2fc;
  uint local_2f8;
  uint local_2f4;
  uint local_2f0;
  uint local_2ec;
  uint local_2e8;
  uint local_2e4;
  undefined1 local_2e0 [16];
  undefined1 auStack_2d0 [16];
  uint local_2c0;
  uint local_2bc;
  uint local_2b8;
  uint local_2b4;
  uint local_2b0;
  uint local_2ac;
  uint local_2a8;
  uint local_2a4;
  undefined1 local_2a0 [16];
  undefined1 auStack_290 [16];
  uint local_280;
  uint local_27c;
  uint local_278;
  uint local_274;
  uint local_270;
  uint local_26c;
  uint local_268;
  uint local_264;
  undefined1 local_260 [16];
  undefined1 auStack_250 [16];
  uint local_240;
  uint local_23c;
  uint local_238;
  uint local_234;
  uint local_230;
  uint local_22c;
  uint local_228;
  uint local_224;
  undefined1 local_220 [16];
  undefined1 auStack_210 [16];
  uint local_200;
  uint local_1fc;
  uint local_1f8;
  uint local_1f4;
  uint local_1f0;
  uint local_1ec;
  uint local_1e8;
  uint local_1e4;
  undefined1 local_1e0 [16];
  undefined1 auStack_1d0 [16];
  uint local_1c0;
  uint local_1bc;
  uint local_1b8;
  uint local_1b4;
  uint local_1b0;
  uint local_1ac;
  uint local_1a8;
  uint local_1a4;
  undefined1 local_1a0 [16];
  undefined1 auStack_190 [16];
  uint local_180;
  uint local_17c;
  uint local_178;
  uint local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  uint local_164;
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  uint local_140;
  uint local_13c;
  uint local_138;
  uint local_134;
  uint local_130;
  uint local_12c;
  uint local_128;
  uint local_124;
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  undefined1 local_e0 [32];
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  undefined1 local_a0 [16];
  undefined1 auStack_90 [16];
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  undefined1 local_60 [32];
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  
  iVar10 = (int)((ulong)in_stack_ffffffffffffefb8 >> 0x20);
  local_7f4 = in_R8D;
  local_7f0 = in_ECX;
  local_7ec = in_EDX;
  local_800 = cospi_arr(in_EDX);
  uVar12 = local_800[0x3e];
  auVar1 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
  auVar1 = vpinsrd_avx(auVar1,uVar12,2);
  local_760 = vpinsrd_avx(auVar1,uVar12,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
  auVar1 = vpinsrd_avx(auVar1,uVar12,2);
  auStack_750 = vpinsrd_avx(auVar1,uVar12,3);
  local_820 = local_760._0_8_;
  uStack_818 = local_760._8_8_;
  uStack_810 = auStack_750._0_8_;
  uStack_808 = auStack_750._8_8_;
  uVar13 = local_800[0xe];
  auVar1 = vpinsrd_avx(ZEXT416(uVar13),uVar13,1);
  auVar1 = vpinsrd_avx(auVar1,uVar13,2);
  local_720 = vpinsrd_avx(auVar1,uVar13,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar13),uVar13,1);
  auVar1 = vpinsrd_avx(auVar1,uVar13,2);
  auStack_710 = vpinsrd_avx(auVar1,uVar13,3);
  local_840 = local_720._0_8_;
  uStack_838 = local_720._8_8_;
  uStack_830 = auStack_710._0_8_;
  uStack_828 = auStack_710._8_8_;
  uVar14 = local_800[0x36];
  auVar1 = vpinsrd_avx(ZEXT416(uVar14),uVar14,1);
  auVar1 = vpinsrd_avx(auVar1,uVar14,2);
  local_6e0 = vpinsrd_avx(auVar1,uVar14,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar14),uVar14,1);
  auVar1 = vpinsrd_avx(auVar1,uVar14,2);
  auStack_6d0 = vpinsrd_avx(auVar1,uVar14,3);
  local_860 = local_6e0._0_8_;
  uStack_858 = local_6e0._8_8_;
  uStack_850 = auStack_6d0._0_8_;
  uStack_848 = auStack_6d0._8_8_;
  uVar15 = local_800[6];
  auVar1 = vpinsrd_avx(ZEXT416(uVar15),uVar15,1);
  auVar1 = vpinsrd_avx(auVar1,uVar15,2);
  local_6a0 = vpinsrd_avx(auVar1,uVar15,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar15),uVar15,1);
  auVar1 = vpinsrd_avx(auVar1,uVar15,2);
  auStack_690 = vpinsrd_avx(auVar1,uVar15,3);
  local_880 = local_6a0._0_8_;
  uStack_878 = local_6a0._8_8_;
  uStack_870 = auStack_690._0_8_;
  uStack_868 = auStack_690._8_8_;
  uVar16 = local_800[10];
  auVar1 = vpinsrd_avx(ZEXT416(uVar16),uVar16,1);
  auVar1 = vpinsrd_avx(auVar1,uVar16,2);
  local_660 = vpinsrd_avx(auVar1,uVar16,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar16),uVar16,1);
  auVar1 = vpinsrd_avx(auVar1,uVar16,2);
  auStack_650 = vpinsrd_avx(auVar1,uVar16,3);
  local_8a0 = local_660._0_8_;
  uStack_898 = local_660._8_8_;
  uStack_890 = auStack_650._0_8_;
  uStack_888 = auStack_650._8_8_;
  uVar17 = local_800[2];
  auVar1 = vpinsrd_avx(ZEXT416(uVar17),uVar17,1);
  auVar1 = vpinsrd_avx(auVar1,uVar17,2);
  local_620 = vpinsrd_avx(auVar1,uVar17,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar17),uVar17,1);
  auVar1 = vpinsrd_avx(auVar1,uVar17,2);
  auStack_610 = vpinsrd_avx(auVar1,uVar17,3);
  local_8c0 = local_620._0_8_;
  uStack_8b8 = local_620._8_8_;
  uStack_8b0 = auStack_610._0_8_;
  uStack_8a8 = auStack_610._8_8_;
  uVar3 = -local_800[0x3a];
  auVar1 = vpinsrd_avx(ZEXT416(uVar3),uVar3,1);
  auVar1 = vpinsrd_avx(auVar1,uVar3,2);
  local_5e0 = vpinsrd_avx(auVar1,uVar3,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar3),uVar3,1);
  auVar1 = vpinsrd_avx(auVar1,uVar3,2);
  auStack_5d0 = vpinsrd_avx(auVar1,uVar3,3);
  local_8e0 = local_5e0._0_8_;
  uStack_8d8 = local_5e0._8_8_;
  uStack_8d0 = auStack_5d0._0_8_;
  uStack_8c8 = auStack_5d0._8_8_;
  uVar4 = -local_800[0x32];
  auVar1 = vpinsrd_avx(ZEXT416(uVar4),uVar4,1);
  auVar1 = vpinsrd_avx(auVar1,uVar4,2);
  local_5a0 = vpinsrd_avx(auVar1,uVar4,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar4),uVar4,1);
  auVar1 = vpinsrd_avx(auVar1,uVar4,2);
  auStack_590 = vpinsrd_avx(auVar1,uVar4,3);
  local_900 = local_5a0._0_8_;
  uStack_8f8 = local_5a0._8_8_;
  uStack_8f0 = auStack_590._0_8_;
  uStack_8e8 = auStack_590._8_8_;
  uVar18 = local_800[0x3c];
  auVar1 = vpinsrd_avx(ZEXT416(uVar18),uVar18,1);
  auVar1 = vpinsrd_avx(auVar1,uVar18,2);
  local_560 = vpinsrd_avx(auVar1,uVar18,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar18),uVar18,1);
  auVar1 = vpinsrd_avx(auVar1,uVar18,2);
  auStack_550 = vpinsrd_avx(auVar1,uVar18,3);
  local_920 = local_560._0_8_;
  uStack_918 = local_560._8_8_;
  uStack_910 = auStack_550._0_8_;
  uStack_908 = auStack_550._8_8_;
  uVar19 = local_800[0xc];
  auVar1 = vpinsrd_avx(ZEXT416(uVar19),uVar19,1);
  auVar1 = vpinsrd_avx(auVar1,uVar19,2);
  local_520 = vpinsrd_avx(auVar1,uVar19,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar19),uVar19,1);
  auVar1 = vpinsrd_avx(auVar1,uVar19,2);
  auStack_510 = vpinsrd_avx(auVar1,uVar19,3);
  local_940 = local_520._0_8_;
  uStack_938 = local_520._8_8_;
  uStack_930 = auStack_510._0_8_;
  uStack_928 = auStack_510._8_8_;
  uVar20 = local_800[4];
  auVar1 = vpinsrd_avx(ZEXT416(uVar20),uVar20,1);
  auVar1 = vpinsrd_avx(auVar1,uVar20,2);
  local_4e0 = vpinsrd_avx(auVar1,uVar20,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar20),uVar20,1);
  auVar1 = vpinsrd_avx(auVar1,uVar20,2);
  auStack_4d0 = vpinsrd_avx(auVar1,uVar20,3);
  local_960 = local_4e0._0_8_;
  uStack_958 = local_4e0._8_8_;
  uStack_950 = auStack_4d0._0_8_;
  uStack_948 = auStack_4d0._8_8_;
  uVar5 = -local_800[0x34];
  auVar1 = vpinsrd_avx(ZEXT416(uVar5),uVar5,1);
  auVar1 = vpinsrd_avx(auVar1,uVar5,2);
  local_4a0 = vpinsrd_avx(auVar1,uVar5,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar5),uVar5,1);
  auVar1 = vpinsrd_avx(auVar1,uVar5,2);
  auStack_490 = vpinsrd_avx(auVar1,uVar5,3);
  local_980 = local_4a0._0_8_;
  uStack_978 = local_4a0._8_8_;
  uStack_970 = auStack_490._0_8_;
  uStack_968 = auStack_490._8_8_;
  uVar21 = local_800[0x38];
  auVar1 = vpinsrd_avx(ZEXT416(uVar21),uVar21,1);
  auVar1 = vpinsrd_avx(auVar1,uVar21,2);
  local_460 = vpinsrd_avx(auVar1,uVar21,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar21),uVar21,1);
  auVar1 = vpinsrd_avx(auVar1,uVar21,2);
  auStack_450 = vpinsrd_avx(auVar1,uVar21,3);
  local_9a0 = local_460._0_8_;
  uStack_998 = local_460._8_8_;
  uStack_990 = auStack_450._0_8_;
  uStack_988 = auStack_450._8_8_;
  uVar22 = local_800[0x18];
  auVar1 = vpinsrd_avx(ZEXT416(uVar22),uVar22,1);
  auVar1 = vpinsrd_avx(auVar1,uVar22,2);
  local_420 = vpinsrd_avx(auVar1,uVar22,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar22),uVar22,1);
  auVar1 = vpinsrd_avx(auVar1,uVar22,2);
  auStack_410 = vpinsrd_avx(auVar1,uVar22,3);
  local_9c0 = local_420._0_8_;
  uStack_9b8 = local_420._8_8_;
  uStack_9b0 = auStack_410._0_8_;
  uStack_9a8 = auStack_410._8_8_;
  uVar23 = local_800[0x28];
  auVar1 = vpinsrd_avx(ZEXT416(uVar23),uVar23,1);
  auVar1 = vpinsrd_avx(auVar1,uVar23,2);
  local_3e0 = vpinsrd_avx(auVar1,uVar23,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar23),uVar23,1);
  auVar1 = vpinsrd_avx(auVar1,uVar23,2);
  auStack_3d0 = vpinsrd_avx(auVar1,uVar23,3);
  local_9e0 = local_3e0._0_8_;
  lStack_9d8 = local_3e0._8_8_;
  lStack_9d0 = auStack_3d0._0_8_;
  lStack_9c8 = auStack_3d0._8_8_;
  local_7a0 = local_800[8];
  auVar1 = vpinsrd_avx(ZEXT416(local_7a0),local_7a0,1);
  auVar1 = vpinsrd_avx(auVar1,local_7a0,2);
  local_3a0 = vpinsrd_avx(auVar1,local_7a0,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_7a0),local_7a0,1);
  auVar1 = vpinsrd_avx(auVar1,local_7a0,2);
  auStack_390 = vpinsrd_avx(auVar1,local_7a0,3);
  local_a00 = local_3a0._0_8_;
  uStack_9f8 = local_3a0._8_8_;
  uStack_9f0 = auStack_390._0_8_;
  uStack_9e8 = auStack_390._8_8_;
  out_shift_00 = -local_800[0x28];
  auVar1 = vpinsrd_avx(ZEXT416(out_shift_00),out_shift_00,1);
  auVar1 = vpinsrd_avx(auVar1,out_shift_00,2);
  local_360 = vpinsrd_avx(auVar1,out_shift_00,3);
  auVar1 = vpinsrd_avx(ZEXT416(out_shift_00),out_shift_00,1);
  auVar1 = vpinsrd_avx(auVar1,out_shift_00,2);
  auStack_350 = vpinsrd_avx(auVar1,out_shift_00,3);
  local_a20 = local_360._0_8_;
  uStack_a18 = local_360._8_8_;
  uStack_a10 = auStack_350._0_8_;
  uStack_a08 = auStack_350._8_8_;
  bd_00 = -local_800[8];
  auVar1 = vpinsrd_avx(ZEXT416(bd_00),bd_00,1);
  auVar1 = vpinsrd_avx(auVar1,bd_00,2);
  local_320 = vpinsrd_avx(auVar1,bd_00,3);
  auVar1 = vpinsrd_avx(ZEXT416(bd_00),bd_00,1);
  auVar1 = vpinsrd_avx(auVar1,bd_00,2);
  auStack_310 = vpinsrd_avx(auVar1,bd_00,3);
  local_a40 = local_320._0_8_;
  uStack_a38 = local_320._8_8_;
  uStack_a30 = auStack_310._0_8_;
  uStack_a28 = auStack_310._8_8_;
  do_cols_00 = -local_800[0x38];
  auVar1 = vpinsrd_avx(ZEXT416(do_cols_00),do_cols_00,1);
  auVar1 = vpinsrd_avx(auVar1,do_cols_00,2);
  local_2e0 = vpinsrd_avx(auVar1,do_cols_00,3);
  auVar1 = vpinsrd_avx(ZEXT416(do_cols_00),do_cols_00,1);
  auVar1 = vpinsrd_avx(auVar1,do_cols_00,2);
  auStack_2d0 = vpinsrd_avx(auVar1,do_cols_00,3);
  local_a60 = local_2e0._0_8_;
  uStack_a58 = local_2e0._8_8_;
  uStack_a50 = auStack_2d0._0_8_;
  uStack_a48 = auStack_2d0._8_8_;
  uVar6 = -local_800[0x18];
  auVar1 = vpinsrd_avx(ZEXT416(uVar6),uVar6,1);
  auVar1 = vpinsrd_avx(auVar1,uVar6,2);
  local_2a0 = vpinsrd_avx(auVar1,uVar6,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar6),uVar6,1);
  auVar1 = vpinsrd_avx(auVar1,uVar6,2);
  auStack_290 = vpinsrd_avx(auVar1,uVar6,3);
  local_a80 = local_2a0._0_8_;
  lStack_a78 = local_2a0._8_8_;
  lStack_a70 = auStack_290._0_8_;
  lStack_a68 = auStack_290._8_8_;
  uVar24 = local_800[0x20];
  auVar1 = vpinsrd_avx(ZEXT416(uVar24),uVar24,1);
  auVar1 = vpinsrd_avx(auVar1,uVar24,2);
  local_260 = vpinsrd_avx(auVar1,uVar24,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar24),uVar24,1);
  auVar1 = vpinsrd_avx(auVar1,uVar24,2);
  auStack_250 = vpinsrd_avx(auVar1,uVar24,3);
  local_aa0 = local_260._0_8_;
  uStack_a98 = local_260._8_8_;
  uStack_a90 = auStack_250._0_8_;
  uStack_a88 = auStack_250._8_8_;
  uVar7 = -local_800[0x20];
  auVar1 = vpinsrd_avx(ZEXT416(uVar7),uVar7,1);
  auVar1 = vpinsrd_avx(auVar1,uVar7,2);
  local_220 = vpinsrd_avx(auVar1,uVar7,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar7),uVar7,1);
  auVar1 = vpinsrd_avx(auVar1,uVar7,2);
  auStack_210 = vpinsrd_avx(auVar1,uVar7,3);
  local_ac0 = local_220._0_8_;
  uStack_ab8 = local_220._8_8_;
  uStack_ab0 = auStack_210._0_8_;
  uStack_aa8 = auStack_210._8_8_;
  uVar25 = local_800[0x30];
  auVar1 = vpinsrd_avx(ZEXT416(uVar25),uVar25,1);
  auVar1 = vpinsrd_avx(auVar1,uVar25,2);
  local_1e0 = vpinsrd_avx(auVar1,uVar25,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar25),uVar25,1);
  auVar1 = vpinsrd_avx(auVar1,uVar25,2);
  auStack_1d0 = vpinsrd_avx(auVar1,uVar25,3);
  local_ae0 = local_1e0._0_8_;
  uStack_ad8 = local_1e0._8_8_;
  uStack_ad0 = auStack_1d0._0_8_;
  uStack_ac8 = auStack_1d0._8_8_;
  local_7c0 = -local_800[0x30];
  auVar1 = vpinsrd_avx(ZEXT416(local_7c0),local_7c0,1);
  auVar1 = vpinsrd_avx(auVar1,local_7c0,2);
  local_1a0 = vpinsrd_avx(auVar1,local_7c0,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_7c0),local_7c0,1);
  auVar1 = vpinsrd_avx(auVar1,local_7c0,2);
  auStack_190 = vpinsrd_avx(auVar1,local_7c0,3);
  local_b00 = local_1a0._0_8_;
  uStack_af8 = local_1a0._8_8_;
  uStack_af0 = auStack_190._0_8_;
  uStack_ae8 = auStack_190._8_8_;
  local_7c4 = local_800[0x10];
  auVar1 = vpinsrd_avx(ZEXT416(local_7c4),local_7c4,1);
  auVar1 = vpinsrd_avx(auVar1,local_7c4,2);
  local_160 = vpinsrd_avx(auVar1,local_7c4,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_7c4),local_7c4,1);
  auVar1 = vpinsrd_avx(auVar1,local_7c4,2);
  auStack_150 = vpinsrd_avx(auVar1,local_7c4,3);
  local_b20 = local_160._0_8_;
  uStack_b18 = local_160._8_8_;
  uStack_b10 = auStack_150._0_8_;
  uStack_b08 = auStack_150._8_8_;
  local_7c8 = -local_800[0x10];
  auVar1 = vpinsrd_avx(ZEXT416(local_7c8),local_7c8,1);
  auVar1 = vpinsrd_avx(auVar1,local_7c8,2);
  local_120 = vpinsrd_avx(auVar1,local_7c8,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_7c8),local_7c8,1);
  auVar1 = vpinsrd_avx(auVar1,local_7c8,2);
  auStack_110 = vpinsrd_avx(auVar1,local_7c8,3);
  local_b40 = local_120._0_8_;
  uStack_b38 = local_120._8_8_;
  uStack_b30 = auStack_110._0_8_;
  uStack_b28 = auStack_110._8_8_;
  local_7cc = 1 << ((char)local_7ec - 1U & 0x1f);
  auVar1 = vpinsrd_avx(ZEXT416(local_7cc),local_7cc,1);
  auVar1 = vpinsrd_avx(auVar1,local_7cc,2);
  auVar1 = vpinsrd_avx(auVar1,local_7cc,3);
  auVar2 = vpinsrd_avx(ZEXT416(local_7cc),local_7cc,1);
  auVar2 = vpinsrd_avx(auVar2,local_7cc,2);
  auVar2 = vpinsrd_avx(auVar2,local_7cc,3);
  local_e0._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  local_e0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  iVar11 = 8;
  if (local_7f0 != 0) {
    iVar11 = 6;
  }
  if (local_7f4 + iVar11 < 0x10) {
    iVar11 = 0x10;
  }
  else {
    iVar11 = 8;
    if (local_7f0 != 0) {
      iVar11 = 6;
    }
    iVar11 = local_7f4 + iVar11;
  }
  local_b64._0_1_ = (char)iVar11;
  local_7d0 = -(1 << ((char)local_b64 - 1U & 0x1f));
  auVar1 = vpinsrd_avx(ZEXT416(local_7d0),local_7d0,1);
  auVar1 = vpinsrd_avx(auVar1,local_7d0,2);
  local_a0 = vpinsrd_avx(auVar1,local_7d0,3);
  auVar1 = vpinsrd_avx(ZEXT416(local_7d0),local_7d0,1);
  auVar1 = vpinsrd_avx(auVar1,local_7d0,2);
  auStack_90 = vpinsrd_avx(auVar1,local_7d0,3);
  local_ba0 = local_a0._0_8_;
  lStack_b98 = local_a0._8_8_;
  lStack_b90 = auStack_90._0_8_;
  lStack_b88 = auStack_90._8_8_;
  local_7d4 = (1 << ((char)local_b64 - 1U & 0x1f)) - 1;
  auVar1 = vpinsrd_avx(ZEXT416(local_7d4),local_7d4,1);
  auVar1 = vpinsrd_avx(auVar1,local_7d4,2);
  auVar1 = vpinsrd_avx(auVar1,local_7d4,3);
  auVar2 = vpinsrd_avx(ZEXT416(local_7d4),local_7d4,1);
  auVar2 = vpinsrd_avx(auVar2,local_7d4,2);
  auVar2 = vpinsrd_avx(auVar2,local_7d4,3);
  local_60._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  local_60._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  local_b64 = iVar11;
  local_7bc = uVar25;
  local_7b8 = uVar7;
  local_7b4 = uVar24;
  local_7b0 = uVar6;
  local_7ac = do_cols_00;
  local_7a8 = bd_00;
  local_7a4 = out_shift_00;
  local_79c = uVar23;
  local_798 = uVar22;
  local_794 = uVar21;
  local_790 = uVar5;
  local_78c = uVar20;
  local_788 = uVar19;
  local_784 = uVar18;
  local_780 = uVar4;
  local_77c = uVar3;
  local_778 = uVar17;
  local_774 = uVar16;
  local_770 = uVar15;
  local_76c = uVar14;
  local_768 = uVar13;
  local_764 = uVar12;
  local_740 = uVar12;
  local_73c = uVar12;
  local_738 = uVar12;
  local_734 = uVar12;
  local_730 = uVar12;
  local_72c = uVar12;
  local_728 = uVar12;
  local_724 = uVar12;
  local_700 = uVar13;
  local_6fc = uVar13;
  local_6f8 = uVar13;
  local_6f4 = uVar13;
  local_6f0 = uVar13;
  local_6ec = uVar13;
  local_6e8 = uVar13;
  local_6e4 = uVar13;
  local_6c0 = uVar14;
  local_6bc = uVar14;
  local_6b8 = uVar14;
  local_6b4 = uVar14;
  local_6b0 = uVar14;
  local_6ac = uVar14;
  local_6a8 = uVar14;
  local_6a4 = uVar14;
  local_680 = uVar15;
  local_67c = uVar15;
  local_678 = uVar15;
  local_674 = uVar15;
  local_670 = uVar15;
  local_66c = uVar15;
  local_668 = uVar15;
  local_664 = uVar15;
  local_640 = uVar16;
  local_63c = uVar16;
  local_638 = uVar16;
  local_634 = uVar16;
  local_630 = uVar16;
  local_62c = uVar16;
  local_628 = uVar16;
  local_624 = uVar16;
  local_600 = uVar17;
  local_5fc = uVar17;
  local_5f8 = uVar17;
  local_5f4 = uVar17;
  local_5f0 = uVar17;
  local_5ec = uVar17;
  local_5e8 = uVar17;
  local_5e4 = uVar17;
  local_5c0 = uVar3;
  local_5bc = uVar3;
  local_5b8 = uVar3;
  local_5b4 = uVar3;
  local_5b0 = uVar3;
  local_5ac = uVar3;
  local_5a8 = uVar3;
  local_5a4 = uVar3;
  local_580 = uVar4;
  local_57c = uVar4;
  local_578 = uVar4;
  local_574 = uVar4;
  local_570 = uVar4;
  local_56c = uVar4;
  local_568 = uVar4;
  local_564 = uVar4;
  local_540 = uVar18;
  local_53c = uVar18;
  local_538 = uVar18;
  local_534 = uVar18;
  local_530 = uVar18;
  local_52c = uVar18;
  local_528 = uVar18;
  local_524 = uVar18;
  local_500 = uVar19;
  local_4fc = uVar19;
  local_4f8 = uVar19;
  local_4f4 = uVar19;
  local_4f0 = uVar19;
  local_4ec = uVar19;
  local_4e8 = uVar19;
  local_4e4 = uVar19;
  local_4c0 = uVar20;
  local_4bc = uVar20;
  local_4b8 = uVar20;
  local_4b4 = uVar20;
  local_4b0 = uVar20;
  local_4ac = uVar20;
  local_4a8 = uVar20;
  local_4a4 = uVar20;
  local_480 = uVar5;
  local_47c = uVar5;
  local_478 = uVar5;
  local_474 = uVar5;
  local_470 = uVar5;
  local_46c = uVar5;
  local_468 = uVar5;
  local_464 = uVar5;
  local_440 = uVar21;
  local_43c = uVar21;
  local_438 = uVar21;
  local_434 = uVar21;
  local_430 = uVar21;
  local_42c = uVar21;
  local_428 = uVar21;
  local_424 = uVar21;
  local_400 = uVar22;
  local_3fc = uVar22;
  local_3f8 = uVar22;
  local_3f4 = uVar22;
  local_3f0 = uVar22;
  local_3ec = uVar22;
  local_3e8 = uVar22;
  local_3e4 = uVar22;
  local_3c0 = uVar23;
  local_3bc = uVar23;
  local_3b8 = uVar23;
  local_3b4 = uVar23;
  local_3b0 = uVar23;
  local_3ac = uVar23;
  local_3a8 = uVar23;
  local_3a4 = uVar23;
  local_380 = local_7a0;
  local_37c = local_7a0;
  local_378 = local_7a0;
  local_374 = local_7a0;
  local_370 = local_7a0;
  local_36c = local_7a0;
  local_368 = local_7a0;
  local_364 = local_7a0;
  local_340 = out_shift_00;
  local_33c = out_shift_00;
  local_338 = out_shift_00;
  local_334 = out_shift_00;
  local_330 = out_shift_00;
  local_32c = out_shift_00;
  local_328 = out_shift_00;
  local_324 = out_shift_00;
  local_300 = bd_00;
  local_2fc = bd_00;
  local_2f8 = bd_00;
  local_2f4 = bd_00;
  local_2f0 = bd_00;
  local_2ec = bd_00;
  local_2e8 = bd_00;
  local_2e4 = bd_00;
  local_2c0 = do_cols_00;
  local_2bc = do_cols_00;
  local_2b8 = do_cols_00;
  local_2b4 = do_cols_00;
  local_2b0 = do_cols_00;
  local_2ac = do_cols_00;
  local_2a8 = do_cols_00;
  local_2a4 = do_cols_00;
  local_280 = uVar6;
  local_27c = uVar6;
  local_278 = uVar6;
  local_274 = uVar6;
  local_270 = uVar6;
  local_26c = uVar6;
  local_268 = uVar6;
  local_264 = uVar6;
  local_240 = uVar24;
  local_23c = uVar24;
  local_238 = uVar24;
  local_234 = uVar24;
  local_230 = uVar24;
  local_22c = uVar24;
  local_228 = uVar24;
  local_224 = uVar24;
  local_200 = uVar7;
  local_1fc = uVar7;
  local_1f8 = uVar7;
  local_1f4 = uVar7;
  local_1f0 = uVar7;
  local_1ec = uVar7;
  local_1e8 = uVar7;
  local_1e4 = uVar7;
  local_1c0 = uVar25;
  local_1bc = uVar25;
  local_1b8 = uVar25;
  local_1b4 = uVar25;
  local_1b0 = uVar25;
  local_1ac = uVar25;
  local_1a8 = uVar25;
  local_1a4 = uVar25;
  local_180 = local_7c0;
  local_17c = local_7c0;
  local_178 = local_7c0;
  local_174 = local_7c0;
  local_170 = local_7c0;
  local_16c = local_7c0;
  local_168 = local_7c0;
  local_164 = local_7c0;
  local_140 = local_7c4;
  local_13c = local_7c4;
  local_138 = local_7c4;
  local_134 = local_7c4;
  local_130 = local_7c4;
  local_12c = local_7c4;
  local_128 = local_7c4;
  local_124 = local_7c4;
  local_100 = local_7c8;
  local_fc = local_7c8;
  local_f8 = local_7c8;
  local_f4 = local_7c8;
  local_f0 = local_7c8;
  local_ec = local_7c8;
  local_e8 = local_7c8;
  local_e4 = local_7c8;
  local_c0 = local_7cc;
  local_bc = local_7cc;
  local_b8 = local_7cc;
  local_b4 = local_7cc;
  local_b0 = local_7cc;
  local_ac = local_7cc;
  local_a8 = local_7cc;
  local_a4 = local_7cc;
  local_80 = local_7d0;
  local_7c = local_7d0;
  local_78 = local_7d0;
  local_74 = local_7d0;
  local_70 = local_7d0;
  local_6c = local_7d0;
  local_68 = local_7d0;
  local_64 = local_7d0;
  local_40 = local_7d4;
  local_3c = local_7d4;
  local_38 = local_7d4;
  local_34 = local_7d4;
  local_30 = local_7d4;
  local_2c = local_7d4;
  local_28 = local_7d4;
  local_24 = local_7d4;
  local_b60 = local_e0._0_16_;
  auStack_b50 = local_e0._16_16_;
  local_bc0 = local_60._0_16_;
  auStack_bb0 = local_60._16_16_;
  half_btf_0_avx2((__m256i *)CONCAT44(uVar12,iVar11),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefcc,in_stack_ffffffffffffefc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),iVar10);
  half_btf_0_avx2((__m256i *)CONCAT44(uVar12,iVar11),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefcc,in_stack_ffffffffffffefc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),iVar10);
  half_btf_0_avx2((__m256i *)CONCAT44(uVar12,iVar11),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefcc,in_stack_ffffffffffffefc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),iVar10);
  half_btf_0_avx2((__m256i *)CONCAT44(uVar12,iVar11),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefcc,in_stack_ffffffffffffefc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),iVar10);
  half_btf_0_avx2((__m256i *)CONCAT44(uVar12,iVar11),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefcc,in_stack_ffffffffffffefc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),iVar10);
  half_btf_0_avx2((__m256i *)CONCAT44(uVar12,iVar11),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefcc,in_stack_ffffffffffffefc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),iVar10);
  half_btf_0_avx2((__m256i *)CONCAT44(uVar12,iVar11),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefcc,in_stack_ffffffffffffefc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),iVar10);
  half_btf_0_avx2((__m256i *)CONCAT44(uVar12,iVar11),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefcc,in_stack_ffffffffffffefc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),iVar10);
  half_btf_0_avx2((__m256i *)CONCAT44(uVar12,iVar11),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefcc,in_stack_ffffffffffffefc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),iVar10);
  half_btf_0_avx2((__m256i *)CONCAT44(uVar12,iVar11),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefcc,in_stack_ffffffffffffefc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),iVar10);
  half_btf_0_avx2((__m256i *)CONCAT44(uVar12,iVar11),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefcc,in_stack_ffffffffffffefc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),iVar10);
  half_btf_0_avx2((__m256i *)CONCAT44(uVar12,iVar11),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefcc,in_stack_ffffffffffffefc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),iVar10);
  half_btf_0_avx2((__m256i *)CONCAT44(uVar12,iVar11),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefcc,in_stack_ffffffffffffefc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),iVar10);
  half_btf_0_avx2((__m256i *)CONCAT44(uVar12,iVar11),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefcc,in_stack_ffffffffffffefc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),iVar10);
  palVar8 = (__m256i *)&local_a80;
  cospim24_00 = (__m256i *)local_b60;
  iVar10 = local_7ec;
  idct32_stage4_avx2((__m256i *)CONCAT44(uVar21,uVar5),(__m256i *)CONCAT44(uVar20,uVar19),
                     (__m256i *)CONCAT44(uVar18,uVar4),(__m256i *)CONCAT44(uVar3,uVar17),
                     (__m256i *)CONCAT44(uVar16,uVar15),(__m256i *)CONCAT44(uVar14,uVar13),
                     (__m256i *)&local_9e0,palVar8,cospim24_00,
                     (__m256i *)CONCAT44(in_stack_ffffffffffffefc4,local_7ec),
                     in_stack_ffffffffffffefc8);
  uVar9 = (undefined4)((ulong)palVar8 >> 0x20);
  half_btf_0_avx2((__m256i *)CONCAT44(uVar12,iVar11),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefcc,in_stack_ffffffffffffefc8),
                  (__m256i *)CONCAT44(in_stack_ffffffffffffefc4,iVar10),
                  (int)((ulong)cospim24_00 >> 0x20));
  idct32_stage5_avx2((__m256i *)CONCAT44(uVar21,uVar5),(__m256i *)CONCAT44(uVar20,uVar19),
                     (__m256i *)CONCAT44(uVar18,uVar4),(__m256i *)CONCAT44(uVar3,uVar17),
                     (__m256i *)CONCAT44(uVar16,uVar15),(__m256i *)CONCAT44(uVar14,uVar13),
                     (__m256i *)local_b60,(__m256i *)CONCAT44(uVar9,local_7ec),(int)cospim24_00);
  palVar8 = (__m256i *)&local_ba0;
  idct32_stage6_avx2((__m256i *)CONCAT44(uVar21,uVar5),(__m256i *)CONCAT44(uVar20,uVar19),
                     (__m256i *)CONCAT44(uVar18,uVar4),(__m256i *)CONCAT44(uVar3,uVar17),
                     (__m256i *)CONCAT44(uVar16,uVar15),(__m256i *)CONCAT44(uVar14,uVar13),palVar8,
                     (__m256i *)local_bc0,(__m256i *)local_b60,
                     (__m256i *)CONCAT44(in_stack_ffffffffffffefc4,local_7ec),
                     in_stack_ffffffffffffefc8);
  idct32_stage7_avx2((__m256i *)CONCAT44(uVar21,uVar5),(__m256i *)CONCAT44(uVar20,uVar19),
                     (__m256i *)CONCAT44(uVar18,uVar4),(__m256i *)CONCAT44(uVar3,uVar17),
                     (__m256i *)CONCAT44(uVar16,uVar15),(__m256i *)CONCAT44(uVar14,uVar13),
                     (int)palVar8);
  idct32_stage8_avx2((__m256i *)CONCAT44(uVar21,uVar5),(__m256i *)CONCAT44(uVar20,uVar19),
                     (__m256i *)CONCAT44(uVar18,uVar4),(__m256i *)CONCAT44(uVar3,uVar17),
                     (__m256i *)CONCAT44(uVar16,uVar15),(__m256i *)CONCAT44(uVar14,uVar13),
                     (int)palVar8);
  idct32_stage9_avx2((__m256i *)CONCAT44(uVar25,uVar7),(__m256i *)CONCAT44(uVar24,uVar6),do_cols_00,
                     bd_00,out_shift_00,(__m256i *)CONCAT44(uVar23,uVar22),palVar8);
  return;
}

Assistant:

static void idct32_low8_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                             int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi62 = _mm256_set1_epi32(cospi[62]);
  const __m256i cospi14 = _mm256_set1_epi32(cospi[14]);
  const __m256i cospi54 = _mm256_set1_epi32(cospi[54]);
  const __m256i cospi6 = _mm256_set1_epi32(cospi[6]);
  const __m256i cospi10 = _mm256_set1_epi32(cospi[10]);
  const __m256i cospi2 = _mm256_set1_epi32(cospi[2]);
  const __m256i cospim58 = _mm256_set1_epi32(-cospi[58]);
  const __m256i cospim50 = _mm256_set1_epi32(-cospi[50]);
  const __m256i cospi60 = _mm256_set1_epi32(cospi[60]);
  const __m256i cospi12 = _mm256_set1_epi32(cospi[12]);
  const __m256i cospi4 = _mm256_set1_epi32(cospi[4]);
  const __m256i cospim52 = _mm256_set1_epi32(-cospi[52]);
  const __m256i cospi56 = _mm256_set1_epi32(cospi[56]);
  const __m256i cospi24 = _mm256_set1_epi32(cospi[24]);
  const __m256i cospi40 = _mm256_set1_epi32(cospi[40]);
  const __m256i cospi8 = _mm256_set1_epi32(cospi[8]);
  const __m256i cospim40 = _mm256_set1_epi32(-cospi[40]);
  const __m256i cospim8 = _mm256_set1_epi32(-cospi[8]);
  const __m256i cospim56 = _mm256_set1_epi32(-cospi[56]);
  const __m256i cospim24 = _mm256_set1_epi32(-cospi[24]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i cospim32 = _mm256_set1_epi32(-cospi[32]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospim48 = _mm256_set1_epi32(-cospi[48]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospim16 = _mm256_set1_epi32(-cospi[16]);
  const __m256i rounding = _mm256_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m256i clamp_lo = _mm256_set1_epi32(-(1 << (log_range - 1)));
  const __m256i clamp_hi = _mm256_set1_epi32((1 << (log_range - 1)) - 1);
  __m256i bf1[32];

  {
    // stage 0
    // stage 1
    bf1[0] = in[0];
    bf1[4] = in[4];
    bf1[8] = in[2];
    bf1[12] = in[6];
    bf1[16] = in[1];
    bf1[20] = in[5];
    bf1[24] = in[3];
    bf1[28] = in[7];

    // stage 2
    bf1[31] = half_btf_0_avx2(&cospi2, &bf1[16], &rounding, bit);
    bf1[16] = half_btf_0_avx2(&cospi62, &bf1[16], &rounding, bit);
    bf1[19] = half_btf_0_avx2(&cospim50, &bf1[28], &rounding, bit);
    bf1[28] = half_btf_0_avx2(&cospi14, &bf1[28], &rounding, bit);
    bf1[27] = half_btf_0_avx2(&cospi10, &bf1[20], &rounding, bit);
    bf1[20] = half_btf_0_avx2(&cospi54, &bf1[20], &rounding, bit);
    bf1[23] = half_btf_0_avx2(&cospim58, &bf1[24], &rounding, bit);
    bf1[24] = half_btf_0_avx2(&cospi6, &bf1[24], &rounding, bit);

    // stage 3
    bf1[15] = half_btf_0_avx2(&cospi4, &bf1[8], &rounding, bit);
    bf1[8] = half_btf_0_avx2(&cospi60, &bf1[8], &rounding, bit);

    bf1[11] = half_btf_0_avx2(&cospim52, &bf1[12], &rounding, bit);
    bf1[12] = half_btf_0_avx2(&cospi12, &bf1[12], &rounding, bit);
    bf1[17] = bf1[16];
    bf1[18] = bf1[19];
    bf1[21] = bf1[20];
    bf1[22] = bf1[23];
    bf1[25] = bf1[24];
    bf1[26] = bf1[27];
    bf1[29] = bf1[28];
    bf1[30] = bf1[31];

    // stage 4
    bf1[7] = half_btf_0_avx2(&cospi8, &bf1[4], &rounding, bit);
    bf1[4] = half_btf_0_avx2(&cospi56, &bf1[4], &rounding, bit);

    bf1[9] = bf1[8];
    bf1[10] = bf1[11];
    bf1[13] = bf1[12];
    bf1[14] = bf1[15];

    idct32_stage4_avx2(bf1, &cospim8, &cospi56, &cospi8, &cospim56, &cospim40,
                       &cospi24, &cospi40, &cospim24, &rounding, bit);

    // stage 5
    bf1[0] = half_btf_0_avx2(&cospi32, &bf1[0], &rounding, bit);
    bf1[1] = bf1[0];
    bf1[5] = bf1[4];
    bf1[6] = bf1[7];

    idct32_stage5_avx2(bf1, &cospim16, &cospi48, &cospi16, &cospim48, &clamp_lo,
                       &clamp_hi, &rounding, bit);

    // stage 6
    bf1[3] = bf1[0];
    bf1[2] = bf1[1];

    idct32_stage6_avx2(bf1, &cospim32, &cospi32, &cospim16, &cospi48, &cospi16,
                       &cospim48, &clamp_lo, &clamp_hi, &rounding, bit);

    // stage 7
    idct32_stage7_avx2(bf1, &cospim32, &cospi32, &clamp_lo, &clamp_hi,
                       &rounding, bit);

    // stage 8
    idct32_stage8_avx2(bf1, &cospim32, &cospi32, &clamp_lo, &clamp_hi,
                       &rounding, bit);

    // stage 9
    idct32_stage9_avx2(bf1, out, do_cols, bd, out_shift, &clamp_lo, &clamp_hi);
  }
}